

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupLevelized(Gia_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  
  uVar2 = Gia_ManLevelNum(p);
  __ptr = calloc((long)(int)(uVar2 + 1),4);
  iVar3 = Gia_ManAndNum(p);
  __ptr_00 = malloc((long)iVar3 << 2);
  for (iVar3 = 0; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManObj(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar4 = Gia_ObjLevel(p,pGVar6);
      piVar1 = (int *)((long)__ptr + (long)iVar4 * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  uVar7 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar7;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    piVar1 = (int *)((long)__ptr + uVar7 * 4 + 4);
    *piVar1 = *piVar1 + *(int *)((long)__ptr + uVar7 * 4);
  }
  for (iVar3 = 0; iVar4 = p->nObjs, iVar3 < iVar4; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManObj(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar4 = p->nObjs;
      break;
    }
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar5 = Gia_ObjLevel(p,pGVar6);
      iVar4 = *(int *)((long)__ptr + (long)iVar5 * 4 + -4);
      *(int *)((long)__ptr + (long)iVar5 * 4 + -4) = iVar4 + 1;
      *(int *)((long)__ptr_00 + (long)iVar4 * 4) = iVar3;
    }
  }
  p_00 = Gia_ManStart(iVar4);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManCi(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar2;
  }
  lVar10 = 0;
  while( true ) {
    iVar3 = Gia_ManAndNum(p);
    if (iVar3 <= lVar10) break;
    pGVar6 = Gia_ManObj(p,*(int *)((long)__ptr_00 + lVar10 * 4));
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar6);
    iVar4 = Gia_ObjFanin1Copy(pGVar6);
    uVar2 = Gia_ManAppendAnd(p_00,iVar3,iVar4);
    pGVar6->Value = uVar2;
    lVar10 = lVar10 + 1;
  }
  for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManCo(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar4 = Gia_ObjFanin0Copy(pGVar6);
    uVar2 = Gia_ManAppendCo(p_00,iVar4);
    pGVar6->Value = uVar2;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  free(__ptr);
  free(__ptr_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLevelized( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    int * pCounts = ABC_CALLOC( int, nLevels + 1 );
    int * pNodes = ABC_ALLOC( int, Gia_ManAndNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pCounts[Gia_ObjLevel(p, pObj)]++;
    for ( i = 1; i <= nLevels; i++ )
        pCounts[i] += pCounts[i-1];
    Gia_ManForEachAnd( p, pObj, i )
        pNodes[pCounts[Gia_ObjLevel(p, pObj)-1]++] = i;
    // duplicate
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManAndNum(p) && (pObj = Gia_ManObj(p, pNodes[i])); i++ )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( pCounts );
    ABC_FREE( pNodes );
    return pNew;
}